

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O1

void wabt::anon_unknown_25::SPrintLimits(char *dst,size_t size,Limits *limits)

{
  uint uVar1;
  
  if (*(char *)(size + 0x10) == '\x01') {
    uVar1 = snprintf(dst,100,"initial: %lu, max: %lu",*(undefined8 *)size,*(undefined8 *)(size + 8))
    ;
  }
  else {
    uVar1 = snprintf(dst,100,"initial: %lu",*(undefined8 *)size);
  }
  if (uVar1 < 100) {
    return;
  }
  __assert_fail("static_cast<size_t>(result) < size",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-logging.cc"
                ,0x2e,
                "void wabt::(anonymous namespace)::SPrintLimits(char *, size_t, const Limits *)");
}

Assistant:

void SPrintLimits(char* dst, size_t size, const Limits* limits) {
  int result;
  if (limits->has_max) {
    result = wabt_snprintf(dst, size, "initial: %" PRIu64 ", max: %" PRIu64,
                           limits->initial, limits->max);
  } else {
    result = wabt_snprintf(dst, size, "initial: %" PRIu64, limits->initial);
  }
  WABT_USE(result);
  assert(static_cast<size_t>(result) < size);
}